

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib503.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  timeval tVar6;
  int maxfd;
  int running;
  timeval interval;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  iVar5 = 0;
  if (iVar1 != 0) {
    test_cold_1();
    iVar5 = iVar1;
  }
  if (iVar5 != 0) goto LAB_00102741;
  lVar2 = curl_easy_init();
  iVar5 = 0;
  if (lVar2 == 0) {
    test_cold_2();
    iVar5 = 0x7c;
  }
  lVar4 = 0;
  if (lVar2 != 0) {
    iVar1 = curl_easy_setopt(lVar2,0x2714,libtest_arg2);
    iVar5 = 0;
    if (iVar1 != 0) {
      test_cold_3();
      iVar5 = iVar1;
    }
    if (iVar5 == 0) {
      iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
      iVar5 = 0;
      if (iVar1 != 0) {
        test_cold_4();
        iVar5 = iVar1;
      }
      lVar4 = 0;
      if (iVar5 == 0) {
        iVar1 = curl_easy_setopt(lVar2,0x2715,"test:ing");
        iVar5 = 0;
        if (iVar1 != 0) {
          test_cold_5();
          iVar5 = iVar1;
        }
        if (iVar5 != 0) goto LAB_001026f7;
        iVar1 = curl_easy_setopt(lVar2,0x2716,"test:ing");
        iVar5 = 0;
        if (iVar1 != 0) {
          test_cold_6();
          iVar5 = iVar1;
        }
        lVar4 = 0;
        if (iVar5 == 0) {
          iVar1 = curl_easy_setopt(lVar2,0x3d,1);
          iVar5 = 0;
          if (iVar1 != 0) {
            test_cold_7();
            iVar5 = iVar1;
          }
          if (iVar5 != 0) goto LAB_001026f7;
          iVar1 = curl_easy_setopt(lVar2,0x2a,1);
          iVar5 = 0;
          if (iVar1 != 0) {
            test_cold_8();
            iVar5 = iVar1;
          }
          lVar4 = 0;
          if (iVar5 == 0) {
            iVar1 = curl_easy_setopt(lVar2,0x29,1);
            iVar5 = 0;
            if (iVar1 != 0) {
              test_cold_9();
              iVar5 = iVar1;
            }
            if (iVar5 != 0) goto LAB_001026f7;
            lVar4 = curl_multi_init();
            if (lVar4 == 0) {
              test_cold_10();
              iVar5 = 0x7b;
            }
            else {
              iVar1 = curl_multi_add_handle(lVar4,lVar2);
              iVar5 = 0;
              if (iVar1 != 0) {
                test_cold_11();
                iVar5 = iVar1;
              }
              if (iVar5 == 0) {
                iVar5 = 0;
                do {
                  local_1d0 = -99;
                  local_1c8.tv_sec = 1;
                  local_1c8.tv_usec = 0;
                  iVar1 = curl_multi_perform(lVar4,&local_1cc);
                  if (iVar1 == 0) {
                    if (local_1cc < 0) {
                      fprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
                              ,0x47);
                      iVar5 = 0x7a;
                    }
                  }
                  else {
                    test_cold_12();
                    iVar5 = iVar1;
                  }
                  iVar1 = 0xc;
                  if (iVar5 == 0) {
                    tVar6 = tutil_tvnow();
                    lVar3 = tutil_tvdiff(tVar6,tv_test_start);
                    if (lVar3 < 0xea61) {
                      if (local_1cc == 0) {
                        iVar5 = 0;
                        iVar1 = 0x31;
                      }
                      else {
                        local_b8.__fds_bits[0xe] = 0;
                        local_b8.__fds_bits[0xf] = 0;
                        local_b8.__fds_bits[0xc] = 0;
                        local_b8.__fds_bits[0xd] = 0;
                        local_b8.__fds_bits[10] = 0;
                        local_b8.__fds_bits[0xb] = 0;
                        local_b8.__fds_bits[8] = 0;
                        local_b8.__fds_bits[9] = 0;
                        local_b8.__fds_bits[6] = 0;
                        local_b8.__fds_bits[7] = 0;
                        local_b8.__fds_bits[4] = 0;
                        local_b8.__fds_bits[5] = 0;
                        local_b8.__fds_bits[2] = 0;
                        local_b8.__fds_bits[3] = 0;
                        local_b8.__fds_bits[0] = 0;
                        local_b8.__fds_bits[1] = 0;
                        local_138.__fds_bits[0] = 0;
                        local_138.__fds_bits[1] = 0;
                        local_138.__fds_bits[2] = 0;
                        local_138.__fds_bits[3] = 0;
                        local_138.__fds_bits[4] = 0;
                        local_138.__fds_bits[5] = 0;
                        local_138.__fds_bits[6] = 0;
                        local_138.__fds_bits[7] = 0;
                        local_138.__fds_bits[8] = 0;
                        local_138.__fds_bits[9] = 0;
                        local_138.__fds_bits[10] = 0;
                        local_138.__fds_bits[0xb] = 0;
                        local_138.__fds_bits[0xc] = 0;
                        local_138.__fds_bits[0xd] = 0;
                        local_138.__fds_bits[0xe] = 0;
                        local_138.__fds_bits[0xf] = 0;
                        local_1b8.__fds_bits[0] = 0;
                        local_1b8.__fds_bits[1] = 0;
                        local_1b8.__fds_bits[2] = 0;
                        local_1b8.__fds_bits[3] = 0;
                        local_1b8.__fds_bits[4] = 0;
                        local_1b8.__fds_bits[5] = 0;
                        local_1b8.__fds_bits[6] = 0;
                        local_1b8.__fds_bits[7] = 0;
                        local_1b8.__fds_bits[8] = 0;
                        local_1b8.__fds_bits[9] = 0;
                        local_1b8.__fds_bits[10] = 0;
                        local_1b8.__fds_bits[0xb] = 0;
                        local_1b8.__fds_bits[0xc] = 0;
                        local_1b8.__fds_bits[0xd] = 0;
                        local_1b8.__fds_bits[0xe] = 0;
                        local_1b8.__fds_bits[0xf] = 0;
                        iVar5 = curl_multi_fdset(lVar4,&local_b8,&local_138,&local_1b8,&local_1d0);
                        if (iVar5 == 0) {
                          iVar5 = 0;
                          if (local_1d0 < -1) {
                            fprintf(_stderr,
                                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
                                    ,0x52);
                            iVar5 = 0x7a;
                          }
                        }
                        else {
                          test_cold_14();
                        }
                        if (iVar5 == 0) {
                          iVar5 = select_wrapper(local_1d0 + 1,&local_b8,&local_138,&local_1b8,
                                                 &local_1c8);
                          if (iVar5 == -1) {
                            test_cold_15();
                            iVar5 = 0x79;
                          }
                          else {
                            tVar6 = tutil_tvnow();
                            lVar3 = tutil_tvdiff(tVar6,tv_test_start);
                            iVar1 = 0;
                            iVar5 = 0;
                            if (60000 < lVar3) {
                              test_cold_16();
                              iVar5 = 0x7d;
                              iVar1 = 0xc;
                            }
                          }
                        }
                      }
                    }
                    else {
                      test_cold_13();
                      iVar5 = 0x7d;
                    }
                  }
                } while (iVar1 == 0);
                if ((iVar1 != 0x31) && (iVar1 != 0xc)) goto LAB_00102741;
              }
            }
          }
        }
      }
    }
    else {
LAB_001026f7:
      lVar4 = 0;
    }
  }
  curl_multi_remove_handle(lVar4,lVar2);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar2);
  curl_global_cleanup();
LAB_00102741:
  return iVar5;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_PROXY, libtest_arg2); /* set in first.c */
  easy_setopt(c, CURLOPT_URL, URL);
  easy_setopt(c, CURLOPT_USERPWD, "test:ing");
  easy_setopt(c, CURLOPT_PROXYUSERPWD, "test:ing");
  easy_setopt(c, CURLOPT_HTTPPROXYTUNNEL, 1L);
  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}